

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,QJsonValue *other)

{
  QCborValue *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QCborValue local_20 [16];
  QCborValue *in_stack_fffffffffffffff0;
  QCborValue *this_00;
  
  this_00 = *(QCborValue **)(in_FS_OFFSET + 0x28);
  ::QCborValue::QCborValue(this_00,in_stack_fffffffffffffff0);
  ::QCborValue::QCborValue(local_20,(nullptr_t)0x0);
  ::QCborValue::operator=(in_RDI,in_RSI);
  ::QCborValue::~QCborValue(in_RSI);
  if (*(QCborValue **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue::QJsonValue(QJsonValue &&other) noexcept
    : value(std::move(other.value))
{
    other.value = QCborValue(nullptr);
}